

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.h
# Opt level: O0

string * mdns::parsePacket(string *__return_storage_ptr__,string *data)

{
  size_type sVar1;
  size_type sVar2;
  ulong uVar3;
  ostream *poVar4;
  char *pcVar5;
  ulong uVar6;
  size_type sVar7;
  long lVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool local_f1;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined4 local_68;
  allocator<char> local_63;
  byte local_62;
  char local_61;
  uint8_t nextPos;
  size_type sStack_60;
  uint8_t length;
  size_t pos;
  string hostname;
  bool hasResponse;
  allocator<char> local_21;
  undefined8 local_20;
  size_t minSize;
  string *data_local;
  
  local_20 = 0x10;
  minSize = (size_t)data;
  data_local = __return_storage_ptr__;
  uVar3 = std::__cxx11::string::size();
  if (uVar3 < 0x10) {
    if ((s_verbose & 1U) != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Packet too small (");
      uVar3 = std::__cxx11::string::size();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
      poVar4 = std::operator<<(poVar4," bytes)");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    pcVar5 = (char *)std::__cxx11::string::operator[](minSize);
    local_f1 = false;
    if (*pcVar5 == '\0') {
      pcVar5 = (char *)std::__cxx11::string::operator[](minSize);
      local_f1 = *pcVar5 == '\0';
    }
    hostname.field_2._M_local_buf[0xb] = (local_f1 ^ 0xffU) & 1;
    if (((s_verbose & 1U) == 0) && (hostname.field_2._M_local_buf[0xb] == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",
                 (allocator<char> *)(hostname.field_2._M_local_buf + 10));
      std::allocator<char>::~allocator((allocator<char> *)(hostname.field_2._M_local_buf + 10));
    }
    else {
      std::__cxx11::string::string((string *)&pos);
      sStack_60 = std::array<unsigned_char,_12UL>::size((array<unsigned_char,_12UL> *)queryHeader);
      while (uVar3 = sStack_60 + 2, uVar6 = std::__cxx11::string::size(), uVar3 < uVar6) {
        pcVar5 = (char *)std::__cxx11::string::operator[](minSize);
        local_61 = *pcVar5;
        sStack_60 = sStack_60 + 1;
        if (local_61 == '\0') break;
        local_62 = (char)sStack_60 + local_61;
        uVar3 = (ulong)local_62;
        uVar6 = std::__cxx11::string::size();
        if (uVar6 <= uVar3) {
          if ((s_verbose & 1U) != 0) {
            poVar4 = std::operator<<((ostream *)&std::cerr,
                                     " ! Invalid packet, next pos out of range (");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)local_62);
            poVar4 = std::operator<<(poVar4," max: ");
            uVar3 = std::__cxx11::string::size();
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
            poVar4 = std::operator<<(poVar4,")");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"",&local_63);
          std::allocator<char>::~allocator(&local_63);
          goto LAB_0010878f;
        }
        std::__cxx11::string::substr((ulong)&local_a8,minSize);
        std::operator+(&local_88,&local_a8,".");
        std::__cxx11::string::operator+=((string *)&pos,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        sStack_60 = (size_type)local_62;
      }
      sVar1 = sStack_60;
      if ((s_verbose & 1U) != 0) {
        sVar7 = std::array<unsigned_char,_4UL>::size((array<unsigned_char,_4UL> *)&queryFooter);
        lVar8 = std::__cxx11::string::size();
        sVar2 = sStack_60;
        if (sVar1 + sVar7 != lVar8) {
          uVar9 = std::__cxx11::string::size();
          uVar10 = std::__cxx11::string::c_str();
          printf("Failed to parse entire packet (%lu/%lu), hostname: %s\n",sVar2,uVar9,uVar10);
        }
      }
      if ((hostname.field_2._M_local_buf[0xb] & 1U) == 0) {
        if ((s_verbose & 1U) != 0) {
          std::operator+(&local_c8,
                         " - Packet with no query response (probably another request) for ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          puts(pcVar5);
          std::__cxx11::string::~string((string *)&local_c8);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_c9);
        std::allocator<char>::~allocator(&local_c9);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pos);
      }
LAB_0010878f:
      local_68 = 1;
      std::__cxx11::string::~string((string *)&pos);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string parsePacket(const std::string &data)
{
    constexpr size_t minSize = queryHeader.size() + 4; // idk
    if (data.size() < minSize) {
        if (s_verbose) std::cerr << "Packet too small (" << data.size() << " bytes)" << std::endl;
        return "";
    }

    const bool hasResponse = !(data[6] == 0 && data[7] == 0);
    if (!s_verbose && !hasResponse) { // if verbose mode is on, parse the name anyways
        return "";
    }

    std::string hostname;
    size_t pos = queryHeader.size();
    while (pos + 2 < data.size()) {
        const uint8_t length = data[pos];
        pos++;

        // Ends with a '.'
        if (length == 0) {
            break;
        }

        const uint8_t nextPos = pos + length;
        if (nextPos >= data.size()) {
            if (s_verbose) std::cerr << " ! Invalid packet, next pos out of range (" << size_t(nextPos) << " max: " << data.size() << ")" << std::endl;
            return "";
        }
        hostname += data.substr(pos, length) + ".";

        pos = nextPos;
    }

    if (s_verbose && pos + queryFooter.size() != data.size()) {
        printf("Failed to parse entire packet (%lu/%lu), hostname: %s\n", pos, data.size(), hostname.c_str());
    }
    // No answers in packet
    if (!hasResponse) {
        if (s_verbose) puts((" - Packet with no query response (probably another request) for " + hostname).c_str());
        return "";
    }

    return hostname;
}